

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O0

void __thiscall pbrt::ThreadPool::ForEachThread(ThreadPool *this,function<void_()> *func)

{
  anon_class_16_2_178e90e4 *in_RSI;
  function<void_(long)> *in_RDI;
  Barrier *barrier;
  undefined8 in_stack_ffffffffffffff78;
  int n;
  Barrier *in_stack_ffffffffffffff80;
  function<void_(long)> *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffc8;
  int64_t in_stack_ffffffffffffffd0;
  
  n = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  operator_new(0x60);
  std::vector<std::thread,_std::allocator<std::thread>_>::size
            ((vector<std::thread,_std::allocator<std::thread>_> *)(in_RDI + 3));
  Barrier::Barrier(in_stack_ffffffffffffff80,n);
  std::vector<std::thread,_std::allocator<std::thread>_>::size
            ((vector<std::thread,_std::allocator<std::thread>_> *)(in_RDI + 3));
  std::function<void(long)>::
  function<pbrt::ThreadPool::ForEachThread(std::function<void()>)::__0,void>(in_RDI,in_RSI);
  ParallelFor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::function<void_(long)>::~function((function<void_(long)> *)0x5282f0);
  return;
}

Assistant:

void ThreadPool::ForEachThread(std::function<void(void)> func) {
    Barrier *barrier = new Barrier(threads.size() + 1);

    ParallelFor(0, threads.size() + 1, [barrier, &func](int64_t) {
        func();
        if (barrier->Block())
            delete barrier;
    });
}